

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

void rgb_565_to_rgb_888(void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
                       int width,int height)

{
  undefined1 *puVar1;
  ushort uVar2;
  uint uVar3;
  undefined1 *puVar4;
  ushort *puVar5;
  int iVar6;
  
  if (0 < height) {
    puVar4 = (undefined1 *)((long)dst + (long)(dy * dst_pitch) + (long)(dx * 3));
    puVar5 = (ushort *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
    iVar6 = 0;
    do {
      if (0 < width) {
        puVar1 = puVar4 + width * 3;
        do {
          uVar2 = *puVar5;
          uVar3 = _al_rgb_scale_5[uVar2 >> 0xb] << 0x10 | _al_rgb_scale_5[uVar2 & 0x1f] |
                  *(int *)((long)_al_rgb_scale_6 + (ulong)(uVar2 >> 3 & 0xfc)) << 8;
          *puVar4 = (char)_al_rgb_scale_5[uVar2 & 0x1f];
          puVar4[1] = (char)(uVar3 >> 8);
          puVar4[2] = (char)(uVar3 >> 0x10);
          puVar5 = puVar5 + 1;
          puVar4 = puVar4 + 3;
        } while (puVar4 < puVar1);
      }
      puVar4 = puVar4 + (dst_pitch + width * -3);
      puVar5 = puVar5 + (src_pitch / 2 - width);
      iVar6 = iVar6 + 1;
    } while (iVar6 != height);
  }
  return;
}

Assistant:

static void rgb_565_to_rgb_888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   uint8_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 1 - width * 3;
   src_ptr += sx;
   dst_ptr += dx * 3;
   for (y = 0; y < height; y++) {
      uint8_t *dst_end = dst_ptr + width * 3;
      while (dst_ptr < dst_end) {
         int dst_pixel = ALLEGRO_CONVERT_RGB_565_TO_RGB_888(*src_ptr);
         #ifdef ALLEGRO_BIG_ENDIAN
         dst_ptr[0] = dst_pixel >> 16;
         dst_ptr[1] = dst_pixel >> 8;
         dst_ptr[2] = dst_pixel;
         #else
         dst_ptr[0] = dst_pixel;
         dst_ptr[1] = dst_pixel >> 8;
         dst_ptr[2] = dst_pixel >> 16;
         #endif
         src_ptr += 1;
         dst_ptr += 1 * 3;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}